

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_CallFlowGraph.h
# Opt level: O3

void soul::CallFlowGraph::calculateLocalVariableStackSize(Function *f)

{
  int iVar1;
  undefined4 extraout_var;
  uint64_t uVar2;
  pool_ref<soul::heart::Variable> *v;
  pointer ppVar3;
  uint64_t uVar4;
  vector<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
  local_38;
  
  if (f->localVariableStackSize == 0) {
    heart::Function::getAllLocalVariables(&local_38,f);
    uVar4 = 0;
    for (ppVar3 = local_38.
                  super__Vector_base<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppVar3 != local_38.
                  super__Vector_base<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; ppVar3 = ppVar3 + 1) {
      iVar1 = (*(ppVar3->object->super_Expression).super_Object._vptr_Object[2])();
      uVar2 = Type::getPackedSizeInBytes((Type *)CONCAT44(extraout_var,iVar1));
      uVar4 = uVar4 + (uVar2 + 7 & 0xfffffffffffffff8);
    }
    if (local_38.
        super__Vector_base<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_38.
                      super__Vector_base<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_38.
                            super__Vector_base<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_38.
                            super__Vector_base<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    f->localVariableStackSize = uVar4;
  }
  return;
}

Assistant:

static void calculateLocalVariableStackSize (heart::Function& f)
    {
        if (f.localVariableStackSize == 0)
        {
            uint64_t total = 0;

            for (auto& v : f.getAllLocalVariables())
                total += getAlignedSize<stackItemAlignment> (v->getType().getPackedSizeInBytes());

            f.localVariableStackSize = total;
        }
    }